

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O3

idx_t __thiscall
duckdb::PhysicalInsert::OnConflictHandling
          (PhysicalInsert *this,TableCatalogEntry *table,ExecutionContext *context,
          InsertGlobalState *gstate,InsertLocalState *lstate,DataChunk *insert_chunk)

{
  _Base_ptr *pp_Var1;
  DataChunk *this_00;
  SelectionVector *this_01;
  pointer puVar2;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar3;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  byte bVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  InsertLocalState *lstate_00;
  undefined8 uVar8;
  SelectionVector *pSVar9;
  PhysicalInsert *op;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  LocalStorage *this_02;
  shared_ptr<duckdb::DataTableInfo,_true> *this_03;
  DataTableInfo *pDVar12;
  pthread_mutex_t *ppVar13;
  ConstraintState *constraint_state;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  type pIVar14;
  mapped_type *pmVar15;
  reference_wrapper<duckdb::Vector> rVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Rb_tree_node_base *p_Var18;
  idx_t iVar19;
  idx_t iVar20;
  NotImplementedException *this_04;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_05;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_06;
  __node_base _Var23;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar24;
  _Hash_node_base *p_Var25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  InsertGlobalState *gstate_00;
  BoundIndex *bound_index;
  _Hash_node_base *p_Var28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  ExecutionContext *context_00;
  vector<std::reference_wrapper<duckdb::Vector>,_true> columns;
  ValidityMask valid;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  sort_keys;
  ConflictInfo conflict_info;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  inner_conflicts;
  unordered_set<duckdb::BoundIndex_*,_std::hash<duckdb::BoundIndex_*>,_std::equal_to<duckdb::BoundIndex_*>,_std::allocator<duckdb::BoundIndex_*>_>
  matched_indexes;
  undefined1 local_1d8 [8];
  reference_wrapper<duckdb::Vector> *prStack_1d0;
  _Base_ptr local_1c8;
  _Rb_tree_node_base *local_1c0;
  _Rb_tree_node_base *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  reference_wrapper<duckdb::Vector> local_1a8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_1a0;
  _Hash_node_base *local_190;
  pthread_mutex_t *local_188;
  InsertLocalState *local_180;
  undefined1 local_178 [32];
  undefined8 uStack_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  OptionalSelection local_148;
  pthread_mutex_t *local_120;
  PhysicalInsert *local_118;
  ExecutionContext *local_110;
  InsertGlobalState *local_108;
  undefined1 local_100 [32];
  _Prime_rehash_policy local_e0;
  OptionalSelection OStack_d0;
  ConflictInfo local_b0;
  _Hash_node_base *local_a0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  local_98;
  _Hashtable<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  DataTable *table_00;
  
  local_108 = gstate;
  iVar11 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
             [0x10])(table);
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar11);
  this_02 = LocalStorage::Get(context->client,table_00->db);
  if (this->action_type == THROW) {
    constraint_state = InsertLocalState::GetConstraintState(lstate,table_00,table);
    storage = LocalStorage::GetStorage(this_02,table_00);
    iVar20 = 0;
    DataTable::VerifyAppendConstraints
              (table_00,constraint_state,context->client,insert_chunk,storage,
               (optional_ptr<duckdb::ConflictManager,_true>)0x0);
  }
  else {
    puVar24 = &this->conflict_target;
    local_b0.only_check_unique = true;
    local_180 = lstate;
    local_b0.column_ids = puVar24;
    this_03 = DataTable::GetDataTableInfo(table_00);
    pDVar12 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_03);
    local_110 = context;
    ppVar13 = (pthread_mutex_t *)LocalStorage::GetIndexes(this_02,context->client,table_00);
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_118 = this;
    if ((this->conflict_target)._M_h._M_element_count == 0) {
      local_120 = (pthread_mutex_t *)&pDVar12->indexes;
      local_188 = ppVar13;
      iVar11 = pthread_mutex_lock(local_120);
      if (iVar11 != 0) {
        ::std::__throw_system_error(iVar11);
      }
      this_05 = (pDVar12->indexes).indexes.
                super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pDVar12->indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_05 != puVar2) {
        do {
          pIVar14 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (this_05);
          iVar11 = (*pIVar14->_vptr_Index[5])(pIVar14);
          if (((byte)((char)iVar11 - 1U) < 2) &&
             (bVar10 = ConflictInfo::ConflictTargetMatches(&local_b0,pIVar14), bVar10)) {
            local_178._0_8_ = pIVar14;
            local_100._0_8_ = &local_68;
            ::std::
            _Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<duckdb::BoundIndex*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::BoundIndex*,false>>>>
                      ((_Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,local_178,local_100);
          }
          this_05 = this_05 + 1;
        } while (this_05 != puVar2);
      }
      pthread_mutex_unlock(local_120);
      ppVar13 = local_188;
      iVar11 = pthread_mutex_lock(local_188);
      if (iVar11 != 0) {
        ::std::__throw_system_error(iVar11);
      }
      this_06 = (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                ppVar13[1].__align;
      puVar3 = *(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> **)
                ((long)ppVar13 + 0x30);
      if (this_06 != puVar3) {
        do {
          pIVar14 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (this_06);
          iVar11 = (*pIVar14->_vptr_Index[5])(pIVar14);
          if (((byte)((char)iVar11 - 1U) < 2) &&
             (bVar10 = ConflictInfo::ConflictTargetMatches(&local_b0,pIVar14), bVar10)) {
            local_178._0_8_ = pIVar14;
            local_100._0_8_ = &local_68;
            ::std::
            _Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<duckdb::BoundIndex*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::BoundIndex*,false>>>>
                      ((_Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,local_178,local_100);
          }
          this_06 = this_06 + 1;
        } while (this_06 != puVar3);
      }
      pthread_mutex_unlock(local_188);
      puVar24 = local_b0.column_ids;
    }
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_100._0_8_ = &OStack_d0;
    local_100._8_8_ = 1;
    local_100._16_8_ = (_Hash_node_base *)0x0;
    local_100._24_8_ = (sel_t *)0x0;
    local_e0._M_max_load_factor = 1.0;
    local_e0._M_next_resize = 0;
    OStack_d0.sel = (SelectionVector *)0x0;
    local_178._24_8_ = insert_chunk->count;
    local_178._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178._0_8_ = (element_type *)0x0;
    local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((puVar24->_M_h)._M_element_count == 0) {
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var23._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          p_Var25 = _Var23._M_nxt[1]._M_nxt;
          PrepareSortKeys(insert_chunk,
                          (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                           *)local_100,
                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)p_Var25[6]._M_nxt);
          local_1d8 = (undefined1  [8])0x0;
          prStack_1d0 = (reference_wrapper<duckdb::Vector> *)0x0;
          local_1c8 = (_Base_ptr)0x0;
          for (p_Var25 = p_Var25[6]._M_nxt; p_Var25 != (_Hash_node_base *)0x0;
              p_Var25 = p_Var25->_M_nxt) {
            pmVar15 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_100,(key_type *)(p_Var25 + 1));
            local_1a8._M_data =
                 unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pmVar15);
            if ((_Base_ptr)prStack_1d0 == local_1c8) {
              ::std::
              vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
              ::_M_realloc_insert<std::reference_wrapper<duckdb::Vector>>
                        ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                          *)local_1d8,(iterator)prStack_1d0,&local_1a8);
            }
            else {
              prStack_1d0->_M_data = local_1a8._M_data;
              prStack_1d0 = prStack_1d0 + 1;
            }
          }
          CheckDistinctnessInternal
                    ((ValidityMask *)local_178,
                     (vector<std::reference_wrapper<duckdb::Vector>,_true> *)local_1d8,
                     insert_chunk->count,
                     (map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                      *)&local_98);
          if (local_1d8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1d8);
          }
          _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt;
        } while (_Var23._M_nxt != (_Hash_node_base *)0x0);
      }
    }
    else {
      PrepareSortKeys(insert_chunk,
                      (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                       *)local_100,
                      (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)(puVar24->_M_h)._M_before_begin._M_nxt);
      local_1d8 = (undefined1  [8])0x0;
      prStack_1d0 = (reference_wrapper<duckdb::Vector> *)0x0;
      local_1c8 = (_Base_ptr)0x0;
      p_Var25 = (puVar24->_M_h)._M_before_begin._M_nxt;
      if (p_Var25 != (_Hash_node_base *)0x0) {
        do {
          pmVar15 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_100,(key_type *)(p_Var25 + 1));
          local_1a8._M_data =
               unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pmVar15);
          if ((_Base_ptr)prStack_1d0 == local_1c8) {
            ::std::
            vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::Vector>>
                      ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                        *)local_1d8,(iterator)prStack_1d0,&local_1a8);
          }
          else {
            prStack_1d0->_M_data = local_1a8._M_data;
            prStack_1d0 = prStack_1d0 + 1;
          }
          p_Var25 = p_Var25->_M_nxt;
        } while (p_Var25 != (_Hash_node_base *)0x0);
      }
      CheckDistinctnessInternal
                ((ValidityMask *)local_178,
                 (vector<std::reference_wrapper<duckdb::Vector>,_true> *)local_1d8,
                 insert_chunk->count,
                 (map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                  *)&local_98);
      if (local_1d8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1d8);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._16_8_);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_100);
    gstate_00 = local_108;
    context_00 = local_110;
    if (local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var25 = (_Hash_node_base *)insert_chunk->count;
      local_100[0] = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      )0x1;
      local_100._24_8_ = (sel_t *)0x0;
      local_e0._M_max_load_factor = 0.0;
      local_e0._4_4_ = 0;
      local_e0._M_next_resize = 0;
      local_100._16_8_ = p_Var25;
      OptionalSelection::OptionalSelection(&OStack_d0,(SelectionVector *)0x0);
      local_100._8_8_ = 0;
      if (local_100[0] !=
          (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           )0x0) {
        SelectionVector::Initialize((SelectionVector *)(local_100 + 0x18),(idx_t)p_Var25);
        _Var7._M_pi = OStack_d0.vec.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        OStack_d0.vec.sel_vector = (sel_t *)local_100._24_8_;
        OStack_d0.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        OStack_d0.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          OStack_d0.sel = (SelectionVector *)(local_100 + 0x18);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
        }
        OStack_d0.sel = &OStack_d0.vec;
      }
      local_1a8._M_data = (type)0x0;
      sStack_1a0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      sStack_1a0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_190 = p_Var25;
      local_1c0 = (_Rb_tree_node_base *)&prStack_1d0;
      prStack_1d0 = (reference_wrapper<duckdb::Vector> *)((ulong)prStack_1d0 & 0xffffffff00000000);
      local_1c8 = (_Base_ptr)0x0;
      local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1b8 = local_1c0;
      if (p_Var25 != (_Hash_node_base *)0x0) {
        rVar16._M_data = (type)0x0;
        p_Var28 = (_Hash_node_base *)0x0;
        do {
          if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var22 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var27 = &local_98._M_impl.super__Rb_tree_header._M_header;
            do {
              p_Var26 = p_Var27;
              p_Var21 = p_Var22;
              p_Var4 = *(_Hash_node_base **)(p_Var21 + 1);
              p_Var27 = p_Var21;
              if (p_Var4 < p_Var28) {
                p_Var27 = p_Var26;
              }
              p_Var22 = (&p_Var21->_M_left)[p_Var4 < p_Var28];
            } while ((&p_Var21->_M_left)[p_Var4 < p_Var28] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var27 != &local_98._M_impl.super__Rb_tree_header) {
              if (p_Var4 < p_Var28) {
                p_Var21 = p_Var26;
              }
              if (*(_Hash_node_base **)(p_Var21 + 1) <= p_Var28) {
                p_Var22 = p_Var27[1]._M_left;
                p_Var21 = p_Var27[1]._M_parent;
                if (p_Var27[1]._M_parent != p_Var22) {
                  do {
                    uVar5 = *(ulong *)p_Var21;
                    if (local_1a8._M_data == (type)0x0) {
                      local_a0 = local_190;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_178,(unsigned_long *)&local_a0);
                      uVar8 = local_178._8_8_;
                      sStack_1a0.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)local_178._0_8_;
                      _Var7._M_pi = sStack_1a0.internal.
                                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
                      local_178._0_8_ = (element_type *)0x0;
                      local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      sStack_1a0.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
                      if ((_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (_Var7._M_pi),
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
                      }
                      pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                                operator->(&sStack_1a0);
                      local_1a8._M_data =
                           (Vector *)
                           (pTVar17->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                      p_Var22 = p_Var27[1]._M_left;
                    }
                    bVar6 = (byte)uVar5 & 0x3f;
                    *(ulong *)(&(local_1a8._M_data)->vector_type + (uVar5 >> 6) * 8) =
                         *(ulong *)(&(local_1a8._M_data)->vector_type + (uVar5 >> 6) * 8) &
                         (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                    pp_Var1 = &p_Var21->_M_parent;
                    if ((_Base_ptr)pp_Var1 == p_Var22) {
                      ::std::
                      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      ::_M_insert_unique<unsigned_long_const&>
                                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                  *)local_1d8,(unsigned_long *)p_Var21);
                      p_Var22 = p_Var27[1]._M_left;
                    }
                    rVar16._M_data = local_1a8._M_data;
                    p_Var21 = (_Base_ptr)pp_Var1;
                  } while ((_Base_ptr)pp_Var1 != p_Var22);
                }
              }
            }
          }
          if ((rVar16._M_data == (type)0x0) ||
             ((*(ulong *)(&(rVar16._M_data)->vector_type + ((ulong)p_Var28 >> 6) * 8) >>
               ((ulong)p_Var28 & 0x3f) & 1) != 0)) {
            if (OStack_d0.sel != (SelectionVector *)0x0) {
              (OStack_d0.sel)->sel_vector[local_100._8_8_] = (sel_t)p_Var28;
            }
            local_100._8_8_ = local_100._8_8_ + 1;
          }
          p_Var28 = (_Hash_node_base *)((long)&p_Var28->_M_nxt + 1);
          gstate_00 = local_108;
        } while (p_Var28 != p_Var25);
      }
      p_Var29 = local_1b0;
      if (local_118->action_type == UPDATE) {
        if ((local_118->do_update_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_178._0_8_ = local_178 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "Inner conflicts detected with a conditional DO UPDATE on-conflict action, not fully implemented yet"
                     ,"");
          NotImplementedException::NotImplementedException(this_04,(string *)local_178);
          __cxa_throw(this_04,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_178[0] = (duckdb)0x1;
        local_178._16_8_ = local_1b0;
        local_178._24_8_ = (sel_t *)0x0;
        uStack_158 = 0;
        local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        OptionalSelection::OptionalSelection(&local_148,(SelectionVector *)0x0);
        this_01 = (SelectionVector *)(local_178 + 0x18);
        local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (local_178[0] != (duckdb)0x0) {
          SelectionVector::Initialize(this_01,(idx_t)p_Var29);
          _Var7._M_pi = local_148.vec.selection_data.internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_148.vec.sel_vector = (sel_t *)local_178._24_8_;
          local_148.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_148.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_148.sel = this_01;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
          }
          local_148.sel = &local_148.vec;
        }
        pSVar9 = local_148.sel;
        p_Var18 = local_1c0;
        p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
        if (local_1c0 != (_Rb_tree_node_base *)&prStack_1d0) {
          do {
            p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var29->_vptr__Sp_counted_base + 1);
            if (pSVar9 != (SelectionVector *)0x0) {
              pSVar9->sel_vector[(long)((long)&p_Var29[-1]._M_weak_count + 3)] = p_Var18[1]._M_color
              ;
            }
            local_178._8_8_ = p_Var29;
            p_Var18 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var18);
          } while (p_Var18 != (_Rb_tree_node_base *)&prStack_1d0);
        }
        this_00 = &local_180->update_chunk;
        DataChunk::Reference(this_00,insert_chunk);
        DataChunk::Slice(this_00,this_01,local_178._8_8_);
        (local_180->update_chunk).count = local_178._8_8_;
        if (local_148.vec.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.vec.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
        }
      }
      DataChunk::Slice(insert_chunk,(SelectionVector *)(local_100 + 0x18),local_100._8_8_);
      insert_chunk->count = local_100._8_8_;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_1d8);
      context_00 = local_110;
      if (sStack_1a0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sStack_1a0.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (OStack_d0.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (OStack_d0.vec.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_next_resize !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_next_resize);
      }
    }
    op = local_118;
    lstate_00 = local_180;
    iVar19 = HandleInsertConflicts<true>
                       (table,context_00,local_180,gstate_00,insert_chunk,local_118);
    iVar20 = HandleInsertConflicts<false>(table,context_00,lstate_00,gstate_00,insert_chunk,op);
    iVar20 = iVar20 + iVar19;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
    ::~_Rb_tree(&local_98);
    ::std::
    _Hashtable<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return iVar20;
}

Assistant:

idx_t PhysicalInsert::OnConflictHandling(TableCatalogEntry &table, ExecutionContext &context, InsertGlobalState &gstate,
                                         InsertLocalState &lstate, DataChunk &insert_chunk) const {
	auto &data_table = table.GetStorage();
	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	if (action_type == OnConflictAction::THROW) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		auto storage = local_storage.GetStorage(data_table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, insert_chunk, storage, nullptr);
		return 0;
	}

	ConflictInfo conflict_info(conflict_target);

	auto &global_indexes = data_table.GetDataTableInfo()->GetIndexes();
	auto &local_indexes = local_storage.GetIndexes(context.client, data_table);

	unordered_set<BoundIndex *> matched_indexes;
	if (conflict_info.column_ids.empty()) {
		// We care about every index that applies to the table if no ON CONFLICT (...) target is given
		global_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
		local_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
	}

	auto inner_conflicts = CheckDistinctness(insert_chunk, conflict_info, matched_indexes);
	idx_t count = insert_chunk.size();
	if (!inner_conflicts.empty()) {
		// We have at least one inner conflict, filter it out
		ManagedSelection sel_vec(count);
		ValidityMask not_a_conflict(count);
		set<idx_t> last_occurrences_of_conflict;
		for (idx_t i = 0; i < count; i++) {
			auto it = inner_conflicts.find(i);
			if (it != inner_conflicts.end()) {
				auto &conflicts = it->second;
				auto conflict_it = conflicts.begin();
				for (; conflict_it != conflicts.end();) {
					auto &idx = *conflict_it;
					not_a_conflict.SetInvalid(idx);
					conflict_it++;
					if (conflict_it == conflicts.end()) {
						last_occurrences_of_conflict.insert(idx);
					}
				}
			}
			if (not_a_conflict.RowIsValid(i)) {
				sel_vec.Append(i);
			}
		}
		if (action_type == OnConflictAction::UPDATE) {
			if (do_update_condition) {
				//! See https://github.com/duckdblabs/duckdb-internal/issues/4090 for context
				throw NotImplementedException("Inner conflicts detected with a conditional DO UPDATE on-conflict "
				                              "action, not fully implemented yet");
			}
			ManagedSelection last_occurrences(last_occurrences_of_conflict.size());
			for (auto &idx : last_occurrences_of_conflict) {
				last_occurrences.Append(idx);
			}

			lstate.update_chunk.Reference(insert_chunk);
			lstate.update_chunk.Slice(last_occurrences.Selection(), last_occurrences.Count());
			lstate.update_chunk.SetCardinality(last_occurrences.Count());
		}

		insert_chunk.Slice(sel_vec.Selection(), sel_vec.Count());
		insert_chunk.SetCardinality(sel_vec.Count());
	}

	// Check whether any conflicts arise, and if they all meet the conflict_target + condition
	// If that's not the case - We throw the first error
	idx_t updated_tuples = 0;
	updated_tuples += HandleInsertConflicts<true>(table, context, lstate, gstate, insert_chunk, *this);
	// Also check the transaction-local storage+ART so we can detect conflicts within this transaction
	updated_tuples += HandleInsertConflicts<false>(table, context, lstate, gstate, insert_chunk, *this);

	return updated_tuples;
}